

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ict.cpp
# Opt level: O2

void __thiscall PrintICT::visit(PrintICT *this,CONSTF *node)

{
  ostream *poVar1;
  uint i;
  uint uVar2;
  
  for (uVar2 = 0; uVar2 < this->level; uVar2 = uVar2 + 1) {
    std::operator<<((ostream *)&std::cout,"|    ");
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"->");
  poVar1 = std::operator<<(poVar1,"CONSTF");
  poVar1 = std::operator<<(poVar1,".");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,node->j);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void PrintICT::visit(CONSTF *node) {
    for (unsigned int i = 0; i < this->level; i++)
        std::cout << "|    ";
    std::cout << "->" << "CONSTF" << "." << node->getJ() << std::endl;
}